

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O0

void calc0<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (options2 *opt)

{
  bool bVar1;
  _Setprecision _Var2;
  invalid_argument *piVar3;
  ostream *os;
  ostream *poVar4;
  void *this;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_00000068;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_00000070;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_00000078;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  f;
  real_t beta;
  real_t t;
  real_t dT;
  real_t Tmax;
  real_t Tmin;
  real_t Jy;
  real_t Jx;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffb98;
  bool local_44d;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffe40;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffe48;
  
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffffb98);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffffb98);
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::mp_wrapper(in_stack_fffffffffffffb88);
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::mp_wrapper(in_stack_fffffffffffffb88);
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::mp_wrapper(in_stack_fffffffffffffb88);
  bVar1 = std::operator==(in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
  if (!bVar1) {
    bVar1 = std::operator==(in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
    if (!bVar1) {
      convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                (in_stack_fffffffffffffb98);
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                (in_stack_fffffffffffffb98);
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                (in_stack_fffffffffffffb98);
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      goto LAB_00121253;
    }
  }
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::mp_wrapper((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::mp_wrapper((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  ising::tc::
  square<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
LAB_00121253:
  bVar1 = operator<((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_stack_fffffffffffffb90,(int *)in_stack_fffffffffffffb88);
  local_44d = true;
  if (!bVar1) {
    local_44d = operator<((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffffb90,(int *)in_stack_fffffffffffffb88);
  }
  if (local_44d != false) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Temperature should be positive");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = operator>((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  if (bVar1) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Tmax should be larger than Tmin");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = operator<=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffffb90,(int *)in_stack_fffffffffffffb88);
  if (!bVar1) {
    os = (ostream *)std::ostream::operator<<(&std::cout,std::scientific);
    _Var2 = std::setprecision(0x32);
    poVar4 = std::operator<<(os,_Var2);
    poVar4 = std::operator<<(poVar4,"# lattice: square\n");
    poVar4 = std::operator<<(poVar4,"# precision: ");
    this = (void *)std::ostream::operator<<(poVar4,0x32);
    poVar4 = (ostream *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar4,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n");
    mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
    ::mp_wrapper((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)os,in_stack_fffffffffffffb88);
    while( true ) {
      operator*((double)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                in_stack_fffffffffffffbe0);
      operator+((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                 *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                in_stack_fffffffffffffbe0);
      bVar1 = operator<((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                         *)os,in_stack_fffffffffffffb88);
      if (!bVar1) break;
      operator/(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe0);
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::mp_wrapper((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)os,in_stack_fffffffffffffb88);
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::mp_wrapper((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)os,in_stack_fffffffffffffb88);
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::mp_wrapper((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)os,in_stack_fffffffffffffb88);
      ising::free_energy::square::
      infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                (in_stack_00000078,in_stack_00000070,in_stack_00000068);
      std::operator<<((ostream *)&std::cout,"inf inf ");
      poVar4 = operator<<(os,in_stack_fffffffffffffb88);
      std::operator<<(poVar4,' ');
      poVar4 = operator<<(os,in_stack_fffffffffffffb88);
      std::operator<<(poVar4,' ');
      poVar4 = operator<<(os,in_stack_fffffffffffffb88);
      std::operator<<(poVar4,' ');
      poVar4 = operator<<(os,in_stack_fffffffffffffb88);
      std::operator<<(poVar4,' ');
      poVar4 = operator<<(os,in_stack_fffffffffffffb88);
      poVar4 = std::operator<<(poVar4," N/A N/A");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      operator+=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)os,in_stack_fffffffffffffb88);
    }
    return;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"dT should be positive");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc0(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    real_t beta = 1 / t;
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << beta << ' '
              << f << " N/A N/A" << std::endl;
  }
}